

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O3

void testStringVectorHelper(exr_context_t f)

{
  undefined8 *puVar1;
  exr_attr_string_t *peVar2;
  exr_result_t eVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  char *in_RCX;
  char *pcVar9;
  exr_attr_string_vector_t sv;
  exr_attr_string_vector_t sv2;
  exr_attr_string_vector_t nil;
  exr_attr_string_vector_t local_48;
  exr_attr_string_vector_t local_38;
  exr_attr_string_vector_t local_28;
  
  local_28.n_strings = 0;
  local_28.alloc_size = 0;
  local_28.strings = (exr_attr_string_t *)0x0;
  if (f == (exr_context_t)0x0) {
    eVar3 = 2;
LAB_00124a38:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar9 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar9 = (char *)exr_get_default_error_message(3);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init (f, __null, 4)",(char *)0x12f,0x345b1f,in_RCX);
  }
  eVar3 = (*f->report_error)(f,3,"Invalid reference to string vector object to assign to");
  if (eVar3 != 3) goto LAB_00124a38;
  eVar3 = exr_attr_string_vector_destroy(f,&local_28);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar9 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_destroy (f, &nil)",(char *)0x131,0x345b1f,in_RCX);
  }
  pcVar9 = (char *)0xfffffffc;
  eVar3 = (*f->print_error)(f,3,
                            "Received request to allocate negative sized string vector (%d entries)"
                           );
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init (f, &sv, -4)",(char *)0x133,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x3fffffff;
  eVar3 = (*f->print_error)(f,3,"Invalid too large size for string vector (%d entries)");
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init (f, &sv, (2147483647) / 2)",(char *)0x136,0x345b1f,
                   pcVar9);
  }
  s_malloc_fail_on = 1;
  local_48.n_strings = 0;
  local_48.alloc_size = 0;
  local_48.strings = (exr_attr_string_t *)0x0;
  local_48.strings = (exr_attr_string_t *)(*f->alloc_fn)(0x10);
  if (local_48.strings != (exr_attr_string_t *)0x0) {
    pcVar9 = (char *)0x100000001;
    local_48.n_strings = 1;
    local_48.alloc_size = 1;
    (local_48.strings)->length = 0;
    (local_48.strings)->alloc_size = 0;
    (local_48.strings)->str = (char *)0x0;
    eVar3 = 0;
LAB_00124cd7:
    s_malloc_fail_on = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init (f, &sv, 1)",(char *)0x138,0x345b1f,pcVar9);
  }
  eVar3 = (*f->standard_error)(f,1);
  s_malloc_fail_on = 0;
  if (eVar3 != 1) goto LAB_00124cd7;
  pcVar9 = (char *)0x0;
  eVar3 = (*f->print_error)(f,3,"Invalid reference to string vector object to initialize index %d");
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init_entry (f, __null, 0, 3)",(char *)0x13c,0x345b1f,
                   pcVar9);
  }
  pcVar9 = (char *)0x3;
  eVar3 = exr_attr_string_vector_init_entry(f,&local_28,0,3);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init_entry (f, &nil, 0, 3)",(char *)0x13f,0x345b1f,pcVar9
                  );
  }
  local_48.n_strings = 0;
  local_48.alloc_size = 0;
  local_48.strings = (exr_attr_string_t *)0x0;
  local_48.strings = (exr_attr_string_t *)(*f->alloc_fn)(0x10);
  if (local_48.strings == (exr_attr_string_t *)0x0) {
    eVar3 = (*f->standard_error)(f,1);
    if (eVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
      pcVar7 = (char *)exr_get_default_error_message(eVar3);
      if (pcVar7 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar8 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      core_test_fail("exr_attr_string_vector_init (f, &sv, 1)",(char *)0x144,0x345b1f,pcVar9);
    }
  }
  else {
    pcVar9 = (char *)0x100000001;
    local_48.n_strings = 1;
    local_48.alloc_size = 1;
    (local_48.strings)->length = 0;
    (local_48.strings)->alloc_size = 0;
    (local_48.strings)->str = (char *)0x0;
  }
  if (local_48.n_strings != 1) {
    core_test_fail("sv.n_strings == 1",(char *)0x145,0x345b1f,pcVar9);
  }
  if (local_48.alloc_size != 1) {
    core_test_fail("sv.alloc_size == 1",(char *)0x146,0x345b1f,pcVar9);
  }
  if (local_48.strings == (exr_attr_string_t *)0x0) {
    core_test_fail("sv.strings != __null",(char *)0x147,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0xffffffff;
  eVar3 = (*f->print_error)(f,3,"Invalid index (%d of %d) initializing string vector",0xffffffff,1);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init_entry (f, &sv, -1, 3)",(char *)0x14b,0x345b1f,pcVar9
                  );
  }
  pcVar9 = (char *)0xfffffffd;
  eVar3 = exr_attr_string_vector_init_entry(f,&local_48,0,-3);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init_entry (f, &sv, 0, -3)",(char *)0x14e,0x345b1f,pcVar9
                  );
  }
  pcVar9 = (char *)0x3;
  eVar3 = exr_attr_string_vector_init_entry(f,&local_48,1,3);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_init_entry (f, &sv, 1, 3)",(char *)0x151,0x345b1f,pcVar9)
    ;
  }
  pcVar9 = (char *)0xffffffff;
  eVar3 = (*f->print_error)(f,3,"Invalid index (%d of %d) assigning string vector (\'%s\', len %d)",
                            0xffffffff,local_48._0_8_ & 0xffffffff,"<nil>",0xffffffff);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, &sv, -1, __null, -1)",
                   (char *)0x155,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0xffffffff;
  eVar3 = (*f->print_error)(f,3,"Invalid index (%d of %d) assigning string vector (\'%s\', len %d)",
                            0xffffffff,local_48._0_8_ & 0xffffffff,"exr",3);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, &sv, -1, \"exr\", 3)",
                   (char *)0x158,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x0;
  eVar3 = exr_attr_string_vector_set_entry_with_length(f,&local_48,0,(char *)0x0,-1);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, &sv, 0, __null, -1)",
                   (char *)0x15b,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x0;
  eVar3 = exr_attr_string_vector_set_entry_with_length(f,&local_48,1,(char *)0x0,-1);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, &sv, 1, __null, -1)",
                   (char *)0x15e,0x345b1f,pcVar9);
  }
  eVar3 = (*f->report_error)(f,3,"Invalid reference to string vector object to assign to");
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_set_entry_with_length (f, __null, 1, __null, -1)",
                   (char *)0x164,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x0;
  eVar3 = exr_attr_string_vector_set_entry_with_length(f,&local_48,0,(char *)0x0,0);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_set_entry (f, &sv, 0, __null)",(char *)0x166,0x345b1f,
                   pcVar9);
  }
  if ((local_48.strings)->length != 0) {
    core_test_fail("sv.strings[0].length == 0",(char *)0x167,0x345b1f,pcVar9);
  }
  if ((local_48.strings)->alloc_size != 1) {
    core_test_fail("sv.strings[0].alloc_size == 1",(char *)0x168,0x345b1f,pcVar9);
  }
  if (*(local_48.strings)->str != '\0') {
    core_test_fail("sv.strings[0].str[0] == \'\\0\'",(char *)0x169,0x345b1f,pcVar9);
  }
  pcVar9 = "exr";
  eVar3 = exr_attr_string_vector_set_entry_with_length(f,&local_48,0,"exr",3);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_set_entry (f, &sv, 0, \"exr\")",(char *)0x16a,0x345b1f,
                   pcVar9);
  }
  if ((local_48.strings)->length != 3) {
    core_test_fail("sv.strings[0].length == 3",(char *)0x16b,0x345b1f,pcVar9);
  }
  if ((local_48.strings)->alloc_size != 4) {
    core_test_fail("sv.strings[0].alloc_size == 4",(char *)0x16c,0x345b1f,pcVar9);
  }
  iVar4 = strcmp((local_48.strings)->str,"exr");
  if (iVar4 != 0) {
    core_test_fail("0 == strcmp (sv.strings[0].str, \"exr\")",(char *)0x16d,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x7;
  eVar3 = exr_attr_string_vector_add_entry_with_length(f,&local_48,"openexr",7);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry (f, &sv, \"openexr\")",(char *)0x16f,0x345b1f,
                   pcVar9);
  }
  if (local_48.n_strings != 2) {
    core_test_fail("sv.n_strings == 2",(char *)0x170,0x345b1f,pcVar9);
  }
  if (local_48.alloc_size != 2) {
    core_test_fail("sv.alloc_size == 2",(char *)0x171,0x345b1f,pcVar9);
  }
  eVar3 = (*f->report_error)(f,3,"Invalid reference to string vector object to assign to");
  peVar2 = local_48.strings;
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, __null, \"foo\", 3)",
                   (char *)0x178,0x345b1f,pcVar9);
  }
  if ((local_48.strings)->length != 3) {
    core_test_fail("sv.strings[0].length == 3",(char *)0x179,0x345b1f,pcVar9);
  }
  if ((local_48.strings)->alloc_size != 4) {
    core_test_fail("sv.strings[0].alloc_size == 4",(char *)0x17a,0x345b1f,pcVar9);
  }
  iVar4 = strcmp((local_48.strings)->str,"exr");
  if (iVar4 != 0) {
    core_test_fail("0 == strcmp (sv.strings[0].str, \"exr\")",(char *)0x17b,0x345b1f,pcVar9);
  }
  if (peVar2[1].length != 7) {
    core_test_fail("sv.strings[1].length == 7",(char *)0x17c,0x345b1f,pcVar9);
  }
  if (peVar2[1].alloc_size != 8) {
    core_test_fail("sv.strings[1].alloc_size == 8",(char *)0x17d,0x345b1f,pcVar9);
  }
  iVar4 = strcmp(peVar2[1].str,"openexr");
  if (iVar4 != 0) {
    core_test_fail("0 == strcmp (sv.strings[1].str, \"openexr\")",(char *)0x17e,0x345b1f,pcVar9);
  }
  eVar3 = exr_attr_string_vector_copy((exr_context_t)0x0,&local_38,&local_48);
  if (eVar3 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_copy (__null, &sv2, &sv)",(char *)0x182,0x345b1f,pcVar9);
  }
  eVar3 = exr_attr_string_vector_copy(f,(exr_attr_string_vector_t *)0x0,&local_48);
  if (eVar3 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_copy (f, __null, &sv)",(char *)0x186,0x345b1f,pcVar9);
  }
  s_malloc_fail_on = 1;
  eVar3 = exr_attr_string_vector_copy(f,&local_38,&local_48);
  s_malloc_fail_on = 0;
  if (eVar3 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_copy (f, &sv2, &sv)",(char *)0x188,0x345b1f,pcVar9);
  }
  s_malloc_fail_on = 2;
  eVar3 = exr_attr_string_vector_copy(f,&local_38,&local_48);
  s_malloc_fail_on = 0;
  if (eVar3 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_copy (f, &sv2, &sv)",(char *)0x18a,0x345b1f,pcVar9);
  }
  eVar3 = exr_attr_string_vector_destroy(f,&local_38);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_destroy (f, &sv2)",(char *)0x18b,0x345b1f,pcVar9);
  }
  eVar3 = exr_attr_string_vector_copy(f,&local_38,&local_48);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_copy (f, &sv2, &sv)",(char *)0x18c,0x345b1f,pcVar9);
  }
  if (local_38.n_strings != 2) {
    core_test_fail("sv2.n_strings == 2",(char *)0x18d,0x345b1f,pcVar9);
  }
  if (local_38.alloc_size != 2) {
    core_test_fail("sv2.alloc_size == 2",(char *)0x18e,0x345b1f,pcVar9);
  }
  if ((local_38.strings)->length != 3) {
    core_test_fail("sv2.strings[0].length == 3",(char *)0x190,0x345b1f,pcVar9);
  }
  if ((local_38.strings)->alloc_size != 4) {
    core_test_fail("sv2.strings[0].alloc_size == 4",(char *)0x191,0x345b1f,pcVar9);
  }
  iVar4 = strcmp((local_38.strings)->str,"exr");
  if (iVar4 != 0) {
    core_test_fail("0 == strcmp (sv2.strings[0].str, \"exr\")",(char *)0x192,0x345b1f,pcVar9);
  }
  if (local_38.strings[1].length != 7) {
    core_test_fail("sv2.strings[1].length == 7",(char *)0x193,0x345b1f,pcVar9);
  }
  if (local_38.strings[1].alloc_size != 8) {
    core_test_fail("sv2.strings[1].alloc_size == 8",(char *)0x194,0x345b1f,pcVar9);
  }
  iVar4 = strcmp(local_38.strings[1].str,"openexr");
  if (iVar4 != 0) {
    core_test_fail("0 == strcmp (sv2.strings[1].str, \"openexr\")",(char *)0x195,0x345b1f,pcVar9);
  }
  eVar3 = exr_attr_string_vector_destroy(f,&local_38);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_destroy (f, &sv2)",(char *)0x196,0x345b1f,pcVar9);
  }
  local_38.n_strings = 0;
  local_38.alloc_size = 0;
  local_38.strings = (exr_attr_string_t *)0x0;
  pcVar9 = (char *)0x3;
  eVar3 = exr_attr_string_vector_add_entry_with_length(f,&local_38,"foo",3);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"foo\", 3)",
                   (char *)0x199,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x3;
  eVar3 = exr_attr_string_vector_add_entry_with_length(f,&local_38,"bar",3);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"bar\", 3)",
                   (char *)0x19b,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x3;
  eVar3 = exr_attr_string_vector_add_entry_with_length(f,&local_38,"baz",3);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"baz\", 3)",
                   (char *)0x19d,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x4;
  eVar3 = exr_attr_string_vector_add_entry_with_length(f,&local_38,"frob",4);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"frob\", 4)",
                   (char *)0x19f,0x345b1f,pcVar9);
  }
  pcVar9 = (char *)0x4;
  eVar3 = exr_attr_string_vector_add_entry_with_length(f,&local_38,"nitz",4);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"nitz\", 4)",
                   (char *)0x1a1,0x345b1f,pcVar9);
  }
  if (local_38.n_strings != 5) {
    core_test_fail("sv2.n_strings == 5",(char *)0x1a2,0x345b1f,pcVar9);
  }
  eVar3 = exr_attr_string_vector_destroy(f,&local_38);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_destroy (f, &sv2)",(char *)0x1a3,0x345b1f,pcVar9);
  }
  local_38.n_strings = 0;
  local_38.alloc_size = 0;
  local_38.strings = (exr_attr_string_t *)0x0;
  s_malloc_fail_on = 1;
  pcVar9 = (char *)0x3;
  eVar3 = exr_attr_string_vector_add_entry_with_length(f,&local_38,"foo",3);
  s_malloc_fail_on = 0;
  if (eVar3 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv2, \"foo\", 3)",
                   (char *)0x1a7,0x345b1f,pcVar9);
  }
  eVar3 = exr_attr_string_vector_destroy(f,&local_48);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_destroy (f, &sv)",(char *)0x1a9,0x345b1f,pcVar9);
  }
  if (local_48.n_strings != 0) {
    core_test_fail("sv.n_strings == 0",(char *)0x1aa,0x345b1f,pcVar9);
  }
  if (local_48.alloc_size != 0) {
    core_test_fail("sv.alloc_size == 0",(char *)0x1ab,0x345b1f,pcVar9);
  }
  if (local_48.strings != (exr_attr_string_t *)0x0) {
    core_test_fail("sv.strings == __null",(char *)0x1ac,0x345b1f,pcVar9);
  }
  eVar3 = exr_attr_string_vector_destroy(f,&local_48);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_destroy (f, &sv)",(char *)0x1ae,0x345b1f,pcVar9);
  }
  local_48.n_strings = 0;
  local_48.alloc_size = 0;
  local_48.strings = (exr_attr_string_t *)0x0;
  local_48.strings = (exr_attr_string_t *)(*f->alloc_fn)(0x7ffffff0);
  if (local_48.strings == (exr_attr_string_t *)0x0) {
    eVar3 = (*f->standard_error)(f,1);
    if (eVar3 != 0) goto LAB_00124a11;
  }
  else {
    local_48.n_strings = 0x7ffffff;
    local_48.alloc_size = 0x7ffffff;
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(local_48.strings)->length + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x7ffffff0);
  }
  pcVar9 = (char *)0x3;
  eVar3 = exr_attr_string_vector_add_entry_with_length(f,&local_48,"exr",3);
  if (eVar3 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n    expected: (",0x10);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(1);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_add_entry_with_length (f, &sv, \"exr\", 3)",(char *)0x1b7
                   ,0x345b1f,pcVar9);
  }
LAB_00124a11:
  eVar3 = exr_attr_string_vector_destroy(f,&local_48);
  if (eVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_attr_string_vector_destroy (f, &sv)",(char *)0x1b9,0x345b1f,pcVar9);
  }
  return;
}

Assistant:

static void
testStringVectorHelper (exr_context_t f)
{
    // TODO: Find a good way to test adding until we grow past the memory limit (i.e. INT32_MAX/2 entries)
    exr_attr_string_vector_t sv, nil = {0};
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_init (NULL, &sv, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_destroy (NULL, &sv));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_init (f, NULL, 4));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, NULL));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &nil));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_init (f, &sv, -4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init (f, &sv, INT32_MAX / 2));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_init (f, &sv, 1));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, NULL, 0, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &nil, 0, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_init_entry (NULL, &nil, 0, 3));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv, 1));
    EXRCORE_TEST (sv.n_strings == 1);
    EXRCORE_TEST (sv.alloc_size == 1);
    EXRCORE_TEST (sv.strings != NULL);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, -1, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, 0, -3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, 1, 3));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, -1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, -1, "exr", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, 0, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, 1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_set_entry_with_length (NULL, &sv, 1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, NULL, 1, NULL, -1));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_set_entry (f, &sv, 0, NULL));
    EXRCORE_TEST (sv.strings[0].length == 0);
    EXRCORE_TEST (sv.strings[0].alloc_size == 1);
    EXRCORE_TEST (sv.strings[0].str[0] == '\0');
    EXRCORE_TEST_RVAL (exr_attr_string_vector_set_entry (f, &sv, 0, "exr"));
    EXRCORE_TEST (sv.strings[0].length == 3);
    EXRCORE_TEST (sv.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv.strings[0].str, "exr"));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_add_entry (f, &sv, "openexr"));
    EXRCORE_TEST (sv.n_strings == 2);
    EXRCORE_TEST (sv.alloc_size == 2);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_add_entry_with_length (NULL, &sv, "foo", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_add_entry_with_length (f, NULL, "foo", 3));
    EXRCORE_TEST (sv.strings[0].length == 3);
    EXRCORE_TEST (sv.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv.strings[0].str, "exr"));
    EXRCORE_TEST (sv.strings[1].length == 7);
    EXRCORE_TEST (sv.strings[1].alloc_size == 8);
    EXRCORE_TEST (0 == strcmp (sv.strings[1].str, "openexr"));
    exr_attr_string_vector_t sv2;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_copy (NULL, &sv2, &sv));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_copy (f, &sv2, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_copy (f, NULL, &sv));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST_RVAL_FAIL_MALLOC_AFTER (
        1, EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST (sv2.n_strings == 2);
    EXRCORE_TEST (sv2.alloc_size == 2);

    EXRCORE_TEST (sv2.strings[0].length == 3);
    EXRCORE_TEST (sv2.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv2.strings[0].str, "exr"));
    EXRCORE_TEST (sv2.strings[1].length == 7);
    EXRCORE_TEST (sv2.strings[1].alloc_size == 8);
    EXRCORE_TEST (0 == strcmp (sv2.strings[1].str, "openexr"));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv2, 0));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "foo", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "bar", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "baz", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "frob", 4));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "nitz", 4));
    EXRCORE_TEST (sv2.n_strings == 5);
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv2, 0));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "foo", 3));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));
    EXRCORE_TEST (sv.n_strings == 0);
    EXRCORE_TEST (sv.alloc_size == 0);
    EXRCORE_TEST (sv.strings == NULL);
    // make sure we can re-delete something?
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));

    // might be on a low memory machine, in which case just skip the test
    if (EXR_ERR_SUCCESS ==
        exr_attr_string_vector_init (
            f, &sv, (int) (INT32_MAX / (int) sizeof (exr_attr_string_t))))
    {
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_OUT_OF_MEMORY,
            exr_attr_string_vector_add_entry_with_length (f, &sv, "exr", 3));
    }
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));
}